

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)49>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  undefined8 this_00;
  bool bVar1;
  Result result;
  VarExpr<(wabt::ExprType)49> *this_01;
  Location local_88;
  undefined1 local_68 [8];
  Var var;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  var.field_2._24_8_ = out_expr;
  Location::Location(&local_88);
  Var::Var((Var *)local_68,0xffffffff,&local_88);
  result = ParseVar(this,(Var *)local_68);
  bVar1 = Failed(result);
  this_00 = var.field_2._24_8_;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_01 = (VarExpr<(wabt::ExprType)49> *)operator_new(0x88);
    VarExpr<(wabt::ExprType)49>::VarExpr(this_01,(Var *)local_68,&loc);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this_00,(pointer)this_01)
    ;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainInstrVar(Location loc,
                                      std::unique_ptr<Expr>* out_expr) {
  Var var;
  CHECK_RESULT(ParseVar(&var));
  out_expr->reset(new T(var, loc));
  return Result::Ok;
}